

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceSumSquareLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducesumsquare(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceSumSquareLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducesumsquare(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducesumsquare(this);
    this_00 = (ReduceSumSquareLayerParams *)operator_new(0x30);
    ReduceSumSquareLayerParams::ReduceSumSquareLayerParams(this_00);
    (this->layer_).reducesumsquare_ = this_00;
  }
  return (ReduceSumSquareLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumSquareLayerParams* NeuralNetworkLayer::mutable_reducesumsquare() {
  if (!has_reducesumsquare()) {
    clear_layer();
    set_has_reducesumsquare();
    layer_.reducesumsquare_ = new ::CoreML::Specification::ReduceSumSquareLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceSumSquare)
  return layer_.reducesumsquare_;
}